

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O3

bool DoesCodecProduceOriginals
               (WirehairCodec decoder,uint N,uint blockBytes,uint finalBytes,uint8_t *message,
               uint8_t *decodedMessage,uint messageBytes)

{
  WirehairResult WVar1;
  int iVar2;
  long lVar3;
  ulong __n;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  uint8_t *__s1;
  uint32_t recoveredBytes;
  uint32_t local_54;
  ulong local_50;
  ulong local_48;
  uint8_t *local_40;
  ulong local_38;
  
  uVar6 = (ulong)messageBytes;
  decodedMessage[uVar6] = 0xee;
  local_40 = message;
  WVar1 = wirehair_recover(decoder,decodedMessage,uVar6);
  if (WVar1 == Wirehair_Success) {
    iVar2 = bcmp(local_40,decodedMessage,uVar6);
    if (iVar2 == 0) {
      if (decodedMessage[uVar6] == 0xee) {
        if (N == 0) {
          return true;
        }
        local_50 = (ulong)finalBytes;
        local_38 = (ulong)(N - 1);
        local_48 = (ulong)blockBytes;
        uVar6 = 0;
        __s1 = local_40;
        while( true ) {
          decodedMessage[local_50] = 0xee;
          local_54 = 0;
          WVar1 = wirehair_recover_block(decoder,(uint)uVar6,decodedMessage,&local_54);
          if (WVar1 != Wirehair_Success) break;
          __n = local_48;
          if ((local_38 == uVar6) && (__n = local_50, decodedMessage[local_50] != 0xee)) {
            pcVar4 = 
            "Failed to wirehair_recover_block memory corruption with original pieces for N = ";
            lVar3 = 0x50;
LAB_00103648:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::endl<char,std::char_traits<char>>(poVar5);
            return false;
          }
          iVar2 = bcmp(__s1,decodedMessage,__n);
          if (iVar2 != 0) {
            pcVar4 = "Failed to wirehair_recover_block the data with original pieces for N = ";
            lVar3 = 0x47;
            goto LAB_00103648;
          }
          __s1 = __s1 + local_48;
          uVar6 = uVar6 + 1;
          if (N == uVar6) {
            return true;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Failed to wirehair_recover_block with original pieces for N = ",0x3e);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", i = ",6);
        goto LAB_00103594;
      }
      pcVar4 = "Failed to recover buffer overrun with original pieces for N = ";
      lVar3 = 0x3e;
    }
    else {
      pcVar4 = "Failed to recover the data with original pieces for N = ";
      lVar3 = 0x38;
    }
  }
  else {
    pcVar4 = "Failed to recover with original pieces for N = ";
    lVar3 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  poVar5 = (ostream *)&std::cout;
LAB_00103594:
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return false;
}

Assistant:

static bool DoesCodecProduceOriginals(
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    // Check buffer overflow
    decodedMessage[messageBytes] = kPadChar;

    WirehairResult recoverResult = wirehair_recover(decoder, decodedMessage, messageBytes);

    if (recoverResult != Wirehair_Success)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover with original pieces for N = " << N << endl;
        return false;
    }

    if (0 != memcmp(message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover the data with original pieces for N = " << N << endl;
        return false;
    }

    if (decodedMessage[messageBytes] != kPadChar)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover buffer overrun with original pieces for N = " << N << endl;
        return false;
    }

    for (unsigned i = 0; i < N; ++i)
    {
        decodedMessage[finalBytes] = kPadChar;

        uint32_t recoveredBytes = 0;
        WirehairResult blockResult = wirehair_recover_block(decoder, i, decodedMessage, &recoveredBytes);

        if (blockResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block with original pieces for N = " << N << ", i = " << i << endl;
            return false;
        }

        if ((i == N - 1) && decodedMessage[finalBytes] != kPadChar)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block memory corruption with original pieces for N = " << N << endl;
            return false;
        }

        const unsigned expectedBytes = (i == N - 1) ? finalBytes : blockBytes;

        if (0 != memcmp(message + i * blockBytes, decodedMessage, expectedBytes))
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block the data with original pieces for N = " << N << endl;
            return false;
        }
    }

    return true;
}